

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O3

void __thiscall
iutest::detail::
TypeParamTestInstance<iu_MultiTypedTest_x_iutest_x_Get_Test,_iutest::detail::TypeList2<iutest::Types<int,_float,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None>,_TestType<TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone>_>_>
::
EachTest<iutest::detail::TypeList2<iutest::Types<int,_float,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None>,_TestType<TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone>_>,_void>
::EachTest(EachTest<iutest::detail::TypeList2<iutest::Types<int,_float,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None,_iutest::detail::None>,_TestType<TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone>_>,_void>
           *this,string *testsuite,char *name,size_t index,char *file,int line)

{
  TestSuite *pTVar1;
  allocator<char> local_59;
  TestInfo *local_58;
  string local_50;
  
  pTVar1 = AddTestSuite((testsuite->_M_dataplus)._M_p,index,file,line);
  (this->m_mediator).super_iuITestSuiteMediator.m_test_suite = pTVar1;
  (this->m_mediator).super_iuITestSuiteMediator._vptr_iuITestSuiteMediator =
       (_func_int **)&PTR__iuITestSuiteMediator_00132ad8;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_59);
  local_58 = &this->m_info;
  TestInfo::TestInfo(local_58,(iuITestSuiteMediator *)this,&local_50,
                     &(this->m_factory).super_iuFactoryBase);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->m_factory).super_iuFactoryBase._vptr_iuFactoryBase =
       (_func_int **)&PTR__iuFactoryBase_00132b98;
  EachTest<iutest::detail::TypeList1<TestType<TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone,_TestNone>_>,_void>
  ::EachTest(&this->m_next,testsuite,name,index + 1,file,line);
  return;
}

Assistant:

EachTest(const ::std::string& testsuite, const char* name, size_t index, const char* file, int line)
            : m_mediator(AddTestSuite(testsuite, index, file, line))
            , m_info(&m_mediator, name, &m_factory)
            , m_next(testsuite, name, index+1, file, line)
        {
        }